

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::UdpEntrySyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,UdpEntrySyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  SyntaxNode *local_a0;
  SyntaxNode *local_90;
  size_t index_local;
  UdpEntrySyntax *this_local;
  
  switch(index) {
  case 0:
    local_90 = (SyntaxNode *)0x0;
    if (this != (UdpEntrySyntax *)0xfffffffffffffff0) {
      local_90 = &(this->preInputs).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_90);
    break;
  case 1:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&this->edgeIndicator->super_SyntaxNode);
    break;
  case 2:
    local_a0 = (SyntaxNode *)0x0;
    if (this != (UdpEntrySyntax *)0xffffffffffffffb8) {
      local_a0 = &(this->postInputs).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_a0);
    break;
  case 3:
    token.kind = (this->colon1).kind;
    token._2_1_ = (this->colon1).field_0x2;
    token.numFlags.raw = (this->colon1).numFlags.raw;
    token.rawLen = (this->colon1).rawLen;
    token.info = (this->colon1).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 4:
    token_00.kind = (this->current).kind;
    token_00._2_1_ = (this->current).field_0x2;
    token_00.numFlags.raw = (this->current).numFlags.raw;
    token_00.rawLen = (this->current).rawLen;
    token_00.info = (this->current).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 5:
    token_01.kind = (this->colon2).kind;
    token_01._2_1_ = (this->colon2).field_0x2;
    token_01.numFlags.raw = (this->colon2).numFlags.raw;
    token_01.rawLen = (this->colon2).rawLen;
    token_01.info = (this->colon2).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 6:
    token_02.kind = (this->next).kind;
    token_02._2_1_ = (this->next).field_0x2;
    token_02.numFlags.raw = (this->next).numFlags.raw;
    token_02.rawLen = (this->next).rawLen;
    token_02.info = (this->next).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 7:
    token_03.kind = (this->semi).kind;
    token_03._2_1_ = (this->semi).field_0x2;
    token_03.numFlags.raw = (this->semi).numFlags.raw;
    token_03.rawLen = (this->semi).rawLen;
    token_03.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_03);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax UdpEntrySyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &preInputs;
        case 1: return edgeIndicator;
        case 2: return &postInputs;
        case 3: return colon1;
        case 4: return current;
        case 5: return colon2;
        case 6: return next;
        case 7: return semi;
        default: return nullptr;
    }
}